

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::DynamicMessageTest_Extensions_Test::TestBody
          (DynamicMessageTest_Extensions_Test *this)

{
  bool bVar1;
  Message *pMVar2;
  Arena *local_170;
  undefined1 local_150 [8];
  ReflectionTester reflection_tester;
  Message *message;
  Arena arena;
  DynamicMessageTest_Extensions_Test *this_local;
  
  arena.impl_.first_arena_.cached_blocks_ = (CachedBlock **)this;
  Arena::Arena((Arena *)&message);
  pMVar2 = (this->super_DynamicMessageTest).extensions_prototype_;
  bVar1 = DynamicMessageTest::use_arena(&this->super_DynamicMessageTest);
  if (bVar1) {
    local_170 = (Arena *)&message;
  }
  else {
    local_170 = (Arena *)0x0;
  }
  pMVar2 = Message::New(pMVar2,local_170);
  TestUtil::ReflectionTester::ReflectionTester
            ((ReflectionTester *)local_150,(this->super_DynamicMessageTest).extensions_descriptor_);
  TestUtil::ReflectionTester::SetAllFieldsViaReflection((ReflectionTester *)local_150,pMVar2);
  TestUtil::ReflectionTester::ExpectAllFieldsSetViaReflection((ReflectionTester *)local_150,pMVar2);
  bVar1 = DynamicMessageTest::use_arena(&this->super_DynamicMessageTest);
  if ((!bVar1) && (pMVar2 != (Message *)0x0)) {
    (*(pMVar2->super_MessageLite)._vptr_MessageLite[1])();
  }
  Arena::~Arena((Arena *)&message);
  return;
}

Assistant:

TEST_P(DynamicMessageTest, Extensions) {
  // Check that extensions work.
  Arena arena;
  Message* message = extensions_prototype_->New(use_arena() ? &arena : nullptr);
  TestUtil::ReflectionTester reflection_tester(extensions_descriptor_);

  reflection_tester.SetAllFieldsViaReflection(message);
  reflection_tester.ExpectAllFieldsSetViaReflection(*message);

  if (!use_arena()) {
    delete message;
  }
}